

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng_ext.c
# Opt level: O3

void light_pcapng_close(light_pcapng_t *pcapng)

{
  if (pcapng != (light_pcapng_t *)0x0) {
    light_pcapng_release(pcapng->pcapng);
    if (pcapng->file != (__fd_t)0x0) {
      light_flush(pcapng->file);
      light_close(pcapng->file);
    }
    light_free_file_info(pcapng->file_info);
    free(pcapng);
    return;
  }
  light_pcapng_close_cold_1();
  return;
}

Assistant:

void light_pcapng_close(light_pcapng_t *pcapng)
{
	DCHECK_NULLP(pcapng, return);
	light_pcapng_release(pcapng->pcapng);
	if (pcapng->file != NULL)
	{
		light_flush(pcapng->file);
		light_close(pcapng->file);
	}
	light_free_file_info(pcapng->file_info);
	free(pcapng);
}